

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

int fy_fetch_block_entry(fy_parser *fyp,int c)

{
  int iVar1;
  fy_atom *pfVar2;
  fy_atom *pfVar3;
  fy_token *pfVar4;
  fy_atom *pfVar5;
  char *pcVar6;
  list_head *plVar7;
  fy_atom local_88;
  undefined8 uStack_50;
  fy_diag_report_ctx local_48;
  
  pfVar2 = (fy_atom *)&local_48;
  pfVar3 = (fy_atom *)&local_48;
  if (c == 0x2d) {
    if (fyp->flow_level == 0) {
      if ((fyp->field_0x70 & 8) != 0) {
        if (fyp->indent < fyp->column) {
          uStack_50 = 0x12efdc;
          iVar1 = fy_push_indent(fyp,fyp->column,false);
          if (iVar1 != 0) {
            pcVar6 = "fy_push_indent() failed";
            iVar1 = 0x748;
            pfVar3 = (fy_atom *)&local_48;
            goto LAB_0012ef4b;
          }
          pfVar2 = &local_88;
          pfVar3 = fy_fill_atom(fyp,0,pfVar2);
          pfVar4 = fy_token_queue_internal(fyp,&fyp->queued_tokens,FYTT_BLOCK_SEQUENCE_START,pfVar3)
          ;
          if (pfVar4 == (fy_token *)0x0) {
            pcVar6 = "fy_token_queue_internal() failed";
            iVar1 = 0x74d;
            goto LAB_0012f35e;
          }
        }
        goto LAB_0012f0f4;
      }
      if (fyp->state == FYPS_BLOCK_MAPPING_VALUE) {
        local_48.has_override = false;
        local_48._17_7_ = 0;
        local_48.override_file = (char *)0x0;
        local_48.override_line = 0;
        local_48.override_column = 0;
        local_48.type = FYET_ERROR;
        local_48.module = FYEM_SCAN;
        pfVar3 = &local_88;
        pfVar2 = fy_fill_atom_at(fyp,0,1,pfVar3);
        local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar2);
        pcVar6 = "block sequence on the same line as a mapping key";
      }
      else if (fyp->state - FYPS_BLOCK_SEQUENCE_FIRST_ENTRY < 2) {
        local_48.has_override = false;
        local_48._17_7_ = 0;
        local_48.override_file = (char *)0x0;
        local_48.override_line = 0;
        local_48.override_column = 0;
        local_48.type = FYET_ERROR;
        local_48.module = FYEM_SCAN;
        pfVar3 = &local_88;
        pfVar2 = fy_fill_atom_at(fyp,0,1,pfVar3);
        local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar2);
        pcVar6 = "block sequence on the same line as a previous item";
      }
      else {
        local_48.has_override = false;
        local_48._17_7_ = 0;
        local_48.override_file = (char *)0x0;
        local_48.override_line = 0;
        local_48.override_column = 0;
        local_48.type = FYET_ERROR;
        local_48.module = FYEM_SCAN;
        pfVar3 = &local_88;
        pfVar2 = fy_fill_atom_at(fyp,0,1,pfVar3);
        local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar2);
        pcVar6 = "block sequence entries not allowed in this context";
      }
    }
    else {
      pfVar2 = (fy_atom *)&local_48;
      if (fyp->indent < fyp->column + 2) {
LAB_0012f0f4:
        plVar7 = (fyp->simple_keys)._lh.next;
        if (plVar7 != (list_head *)0x0 && plVar7 != &(fyp->simple_keys)._lh) {
          while (fyp->flow_level <= *(int *)&plVar7[3].prev) {
            if (((ulong)plVar7[3].prev & 0x100000000) != 0) {
              pfVar4 = (fy_token *)plVar7[3].next;
              if (pfVar4 == (fy_token *)0x0) {
                local_48.has_override = false;
                local_48._17_7_ = 0;
                local_48.override_file = (char *)0x0;
                local_48.override_line = 0;
                local_48.override_column = 0;
                local_48.type = FYET_ERROR;
                local_48.module = FYEM_SCAN;
                pfVar3 = (fy_atom *)&pfVar2[-2].increment;
                pfVar2[-2].fyi = (fy_input *)0x12f2e0;
                pfVar5 = fy_fill_atom_at(fyp,0,1,pfVar3);
                pfVar2[-2].fyi = (fy_input *)0x12f2ef;
                local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar5);
              }
              else {
                if (pfVar4->type - FYTT_ANCHOR < 2) {
                  local_48.has_override = false;
                  local_48._17_7_ = 0;
                  local_48.override_file = (char *)0x0;
                  local_48.override_line = 0;
                  local_48.override_column = 0;
                  local_48.type = FYET_ERROR;
                  local_48.module = FYEM_SCAN;
                  *(undefined8 *)&pfVar2[-1].increment = 0x12f247;
                  local_48.fyt = fy_token_ref(pfVar4);
                  pcVar6 = "tag";
                  if (*(int *)&plVar7[3].next[1].next == 0x13) {
                    pcVar6 = "anchor";
                  }
                  *(undefined8 *)&pfVar2[-1].increment = 0x12f279;
                  fy_parser_diag_report(fyp,&local_48,"invalid %s indent for sequence",pcVar6);
                  return -1;
                }
                local_48.has_override = false;
                local_48._17_7_ = 0;
                local_48.override_file = (char *)0x0;
                local_48.override_line = 0;
                local_48.override_column = 0;
                local_48.type = FYET_ERROR;
                local_48.module = FYEM_SCAN;
                *(undefined8 *)&pfVar2[-1].increment = 0x12f310;
                local_48.fyt = fy_token_ref(pfVar4);
                pfVar3 = pfVar2;
              }
              pcVar6 = "missing \':\'";
              goto LAB_0012f31b;
            }
            plVar7 = plVar7->next;
            if ((plVar7 == &(fyp->simple_keys)._lh) || (plVar7 == (list_head *)0x0)) break;
          }
        }
        *(undefined8 *)&pfVar2[-1].increment = 0x12f11f;
        iVar1 = fy_remove_simple_key(fyp,FYTT_BLOCK_ENTRY);
        if (iVar1 == 0) {
          fyp->field_0x70 = fyp->field_0x70 | 8;
          pfVar2[-1].fyi = (fy_input *)"true";
          pfVar2[-1].storage_hint = 0x12f1aa;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x76c,"fy_fetch_block_entry","simple_key_allowed -> %s\n");
          pfVar2[-2].fyi = (fy_input *)0x12f1c3;
          pfVar3 = fy_fill_atom(fyp,1,(fy_atom *)&pfVar2[-2].increment);
          pfVar2[-2].fyi = (fy_input *)0x12f1d5;
          pfVar4 = fy_token_queue(fyp,FYTT_BLOCK_ENTRY,pfVar3);
          if (pfVar4 != (fy_token *)0x0) {
            pfVar2[-2].fyi = (fy_input *)0x12f1e8;
            iVar1 = fy_parse_peek_at_offset(fyp,0);
            if ((iVar1 != 0x20) && (iVar1 != 9)) {
              return 0;
            }
            pfVar2[-2].fyi = (fy_input *)0x12f200;
            fy_advance(fyp,iVar1);
            return 0;
          }
          pcVar6 = "fy_token_queue() failed";
          iVar1 = 0x770;
          pfVar2 = (fy_atom *)&pfVar2[-2].increment;
LAB_0012f35e:
          *(undefined8 *)&pfVar2[-1].increment = 0x12f365;
          fy_parser_diag(fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,iVar1,"fy_fetch_block_entry",pcVar6);
          return 0;
        }
        pcVar6 = "fy_remove_simple_key() failed";
        iVar1 = 0x769;
        pfVar3 = pfVar2;
        goto LAB_0012ef4b;
      }
      local_48.has_override = false;
      local_48._17_7_ = 0;
      local_48.override_file = (char *)0x0;
      local_48.override_line = 0;
      local_48.override_column = 0;
      local_48.type = FYET_ERROR;
      local_48.module = FYEM_SCAN;
      pfVar3 = &local_88;
      pfVar2 = fy_fill_atom_at(fyp,0,1,pfVar3);
      local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar2);
      pcVar6 = "wrongly indented block sequence in flow mode";
    }
LAB_0012f31b:
    *(undefined8 *)&pfVar3[-1].increment = 0x12f328;
    fy_parser_diag_report(fyp,&local_48,pcVar6);
  }
  else {
    pcVar6 = "illegal block entry";
    iVar1 = 0x72c;
LAB_0012ef4b:
    *(undefined8 *)((long)pfVar3 + -8) = 0x12ef52;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,iVar1,"fy_fetch_block_entry",pcVar6);
  }
  return -1;
}

Assistant:

int fy_fetch_block_entry(struct fy_parser *fyp, int c) {
    int rc;
    struct fy_mark mark;
    struct fy_simple_key *fysk;
    struct fy_token *fyt;

    fyp_error_check(fyp, c == '-', err_out,
                    "illegal block entry");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || (fyp->column + 2) > fyp->indent, err_out,
                          "wrongly indented block sequence in flow mode");

    if (!(fyp->flow_level || fyp->simple_key_allowed)) {
        if (!fyp->simple_key_allowed && fyp->state == FYPS_BLOCK_MAPPING_VALUE)
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence on the same line as a mapping key");
        else if (fyp->state == FYPS_BLOCK_SEQUENCE_FIRST_ENTRY ||
                 fyp->state == FYPS_BLOCK_SEQUENCE_ENTRY)
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence on the same line as a previous item");
        else
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence entries not allowed in this context");
        goto err_out;
    }

    /* we have to save the start mark */
    fy_get_mark(fyp, &mark);

    if (!fyp->flow_level && fyp->indent < fyp->column) {

        /* push the new indent level */
        rc = fy_push_indent(fyp, fyp->column, false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fyt = fy_token_queue_internal(fyp, &fyp->queued_tokens,
                                      FYTT_BLOCK_SEQUENCE_START, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    if (c == '-' && fyp->flow_level) {
        /* this is an error, but we let the parser catch it */
        ;
    }

    fysk = fy_would_remove_required_simple_key(fyp);

    if (fysk) {
        if (fysk->token) {
            if (fysk->token->type == FYTT_ANCHOR || fysk->token->type == FYTT_TAG)
                FYP_TOKEN_ERROR(fyp, fysk->token, FYEM_SCAN,
                                "invalid %s indent for sequence",
                                fysk->token->type == FYTT_ANCHOR ?
                                "anchor" : "tag");
            else
                FYP_TOKEN_ERROR(fyp, fysk->token, FYEM_SCAN,
                                "missing ':'");
        } else
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "missing ':'");
        goto err_out;
    }

    rc = fy_remove_simple_key(fyp, FYTT_BLOCK_ENTRY);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_remove_simple_key() failed");

    fyp->simple_key_allowed = true;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    fyt = fy_token_queue(fyp, FYTT_BLOCK_ENTRY, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    /* special case for allowing whitespace (including tabs) after - */
    if (fy_is_ws(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}